

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O0

self_ * __thiscall
standards::exp_number<float>::operator+=(exp_number<float> *this,exp_number<float> *rhs)

{
  float fVar1;
  float *pfVar2;
  float *in_RSI;
  self_ *in_RDI;
  self_ *psVar3;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Da_00;
  double dVar4;
  
  if (in_RDI->sign_ == 1) {
    if (in_RSI[1] == 1.4013e-45) {
      psVar3 = in_RDI;
      pfVar2 = std::max<float>(&in_RDI->log_,in_RSI);
      fVar1 = *pfVar2;
      std::abs((int)psVar3);
      dVar4 = std::exp((double)(ulong)(extraout_XMM0_Da ^ 0x80000000));
      dVar4 = std::log((double)(ulong)(uint)(SUB84(dVar4,0) + 1.0));
      in_RDI->log_ = fVar1 + SUB84(dVar4,0);
    }
    else if (in_RSI[1] == -NAN) {
      if (in_RDI->log_ < *in_RSI || in_RDI->log_ == *in_RSI) {
        if (*in_RSI <= in_RDI->log_) {
          in_RDI->sign_ = 0;
        }
        else {
          fVar1 = *in_RSI;
          dVar4 = std::exp((double)(ulong)(uint)(in_RDI->log_ - *in_RSI));
          dVar4 = std::log((double)(ulong)(uint)(1.0 - SUB84(dVar4,0)));
          in_RDI->log_ = fVar1 + SUB84(dVar4,0);
          in_RDI->sign_ = -1;
        }
      }
      else {
        fVar1 = in_RDI->log_;
        dVar4 = std::exp((double)(ulong)(uint)(*in_RSI - in_RDI->log_));
        dVar4 = std::log((double)(ulong)(uint)(1.0 - SUB84(dVar4,0)));
        in_RDI->log_ = fVar1 + SUB84(dVar4,0);
      }
    }
  }
  else if (in_RDI->sign_ == -1) {
    if (in_RSI[1] == 1.4013e-45) {
      if (in_RDI->log_ < *in_RSI || in_RDI->log_ == *in_RSI) {
        if (*in_RSI <= in_RDI->log_) {
          in_RDI->sign_ = 0;
        }
        else {
          fVar1 = *in_RSI;
          dVar4 = std::exp((double)(ulong)(uint)(in_RDI->log_ - *in_RSI));
          dVar4 = std::log((double)(ulong)(uint)(1.0 - SUB84(dVar4,0)));
          in_RDI->log_ = fVar1 + SUB84(dVar4,0);
          in_RDI->sign_ = 1;
        }
      }
      else {
        fVar1 = in_RDI->log_;
        dVar4 = std::exp((double)(ulong)(uint)(*in_RSI - in_RDI->log_));
        dVar4 = std::log((double)(ulong)(uint)(1.0 - SUB84(dVar4,0)));
        in_RDI->log_ = fVar1 + SUB84(dVar4,0);
      }
    }
    else if (in_RSI[1] == -NAN) {
      psVar3 = in_RDI;
      pfVar2 = std::max<float>(&in_RDI->log_,in_RSI);
      fVar1 = *pfVar2;
      std::abs((int)psVar3);
      dVar4 = std::exp((double)(ulong)(extraout_XMM0_Da_00 ^ 0x80000000));
      dVar4 = std::log((double)(ulong)(uint)(SUB84(dVar4,0) + 1.0));
      in_RDI->log_ = fVar1 + SUB84(dVar4,0);
    }
  }
  else {
    in_RDI->log_ = *in_RSI;
    in_RDI->sign_ = (int32_t)in_RSI[1];
  }
  return in_RDI;
}

Assistant:

self_& operator+=(exp_number<U> const& rhs) {
    if (sign_ == is_positive) {
      if (rhs.sign_ == is_positive) {
        // pos + pos
        log_ = std::max(log_, rhs.log_) + std::log(1 + std::exp(-std::abs(log_ - rhs.log_)));
      } else if (rhs.sign_ == is_negative) {
        if (log_ > rhs.log_) {
          // pos + neg = pos
          log_ = log_ + std::log(1 - std::exp(rhs.log_ - log_));
        } else if (log_ < rhs.log_) {
          // pos + neg = neg
          log_ = rhs.log_ + std::log(1 - std::exp(log_ - rhs.log_));
          sign_ = is_negative;
        } else {
          // pos + neg = zero
          sign_ = is_zero;
        }
      }
    } else if (sign_ == is_negative) {
      if (rhs.sign_ == is_positive) {
        if (log_ > rhs.log_) {
          // neg + pos = neg
          log_ = log_ + std::log(1 - std::exp(rhs.log_ - log_));
        } else if (log_ < rhs.log_) {
          // neg + pos = pos
          log_ = rhs.log_ + std::log(1 - std::exp(log_ - rhs.log_));
          sign_ = is_positive;
        } else {
          // neg + pos = zero
          sign_ = is_zero;
        }
      } else if (rhs.sign_ == is_negative)
        // neg + neg
        log_ = std::max(log_, rhs.log_) + std::log(1 + std::exp(-std::abs(log_ - rhs.log_)));
    } else {
      log_ = rhs.log_;
      sign_ = rhs.sign_;
    }
    return *this;
  }